

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_DoublingFactorCounterTest_Flush_TestShell::createTest
          (TEST_DoublingFactorCounterTest_Flush_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Flush_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_Flush_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x28e);
  TEST_DoublingFactorCounterTest_Flush_Test::TEST_DoublingFactorCounterTest_Flush_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, Flush)
{
	addPair(Tile::OneOfCharacters);
	addTriplet(Tile::TwoOfCharacters, true);
	addTriplet(Tile::FourOfCharacters, false);
	addSequence(Tile::SixOfCharacters, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::Flush));
	CHECK_EQUAL(6, r.doubling_factor);
}